

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionObjects.cpp
# Opt level: O0

ptr<Value> __thiscall
ExceptionObjects::simple_exception(ExceptionObjects *this,string *type,string *message)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  ptr<Value> pVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  allocator<char> local_d1;
  Identifier local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  allocator<char> local_79;
  Identifier local_78;
  undefined1 local_58 [8];
  ObjectBuilder builder;
  string *message_local;
  string *type_local;
  
  builder.members.symbols._M_h._M_single_bucket = (__node_base_ptr)message;
  ObjectBuilder::ObjectBuilder((ObjectBuilder *)local_58);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"type",&local_79);
  make<String,std::__cxx11::string_const&>(&local_b0);
  std::shared_ptr<Value>::shared_ptr<String,void>
            ((shared_ptr<Value> *)&local_b0.field_2,(shared_ptr<String> *)&local_b0);
  ObjectBuilder::putAttribute
            ((ObjectBuilder *)local_58,&local_78,true,(ptr<Value> *)&local_b0.field_2,Public);
  std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)&local_b0.field_2);
  std::shared_ptr<String>::~shared_ptr((shared_ptr<String> *)&local_b0);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"message",&local_d1);
  make<String,std::__cxx11::string_const&>(&local_f8);
  std::shared_ptr<Value>::shared_ptr<String,void>
            ((shared_ptr<Value> *)&local_f8.field_2,(shared_ptr<String> *)&local_f8);
  ObjectBuilder::putAttribute
            ((ObjectBuilder *)local_58,&local_d0,true,(ptr<Value> *)&local_f8.field_2,Public);
  std::shared_ptr<Value>::~shared_ptr((shared_ptr<Value> *)&local_f8.field_2);
  std::shared_ptr<String>::~shared_ptr((shared_ptr<String> *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  ObjectBuilder::build((ObjectBuilder *)this);
  ObjectBuilder::~ObjectBuilder((ObjectBuilder *)local_58);
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = extraout_RDX._M_pi
  ;
  pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (ptr<Value>)pVar1.super___shared_ptr<Value,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ptr<Value> ExceptionObjects::simple_exception(const std::string &type, const std::string &message) {
    ObjectBuilder builder;
    builder.putAttribute("type", true, make<String>(type));
    builder.putAttribute("message", true, make<String>(message));
    return builder.build();
}